

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.h
# Opt level: O0

_vector3<float> * __thiscall
xray_re::xr_flexbuf::copy<xray_re::_vector3<float>>
          (xr_flexbuf *this,_vector3<float> *source,_vector3<float> *target,size_t size)

{
  size_t size_local;
  _vector3<float> *target_local;
  _vector3<float> *source_local;
  xr_flexbuf *this_local;
  
  std::uninitialized_copy<xray_re::_vector3<float>const*,xray_re::_vector3<float>*>
            (source,source + size,target);
  return target;
}

Assistant:

inline T* xr_flexbuf::copy(const T* source, T* target, size_t size) const
{
#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1600
	stdext::unchecked_uninitialized_copy(source, source + size, target);
#else
	std::uninitialized_copy(source, source + size, target);
#endif
	return target;
}